

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

void duckdb::ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  BoundFunctionExpression *pBVar12;
  reference pvVar13;
  Vector *vector;
  Vector *vector_00;
  long lVar14;
  InvalidInputException *pIVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  string local_140;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pbVar6 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(args + 0x18);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar13);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar13);
  lVar14 = duckdb::ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar13,(UnifiedVectorFormat *)pbVar6);
  pvVar13 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar13,(UnifiedVectorFormat *)pbVar6);
  if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar7 = *(long *)(vector + 0x20);
    lVar8 = *(long *)(vector_00 + 0x20);
    lVar14 = *(long *)(lVar14 + 0x20);
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar16 = pbVar17;
      if (*local_78[0] != 0) {
        pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_78[0] + (long)pbVar17 * 4);
      }
      params = pbVar17;
      if (*local_c0[0] != 0) {
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)*(uint *)(*local_c0[0] + (long)pbVar17 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + ((ulong)pbVar16 >> 6) * 8) >> ((ulong)pbVar16 & 0x3f) & 1) != 0))
         && ((local_b0 == 0 ||
             ((*(ulong *)(local_b0 + ((ulong)params >> 6) * 8) >> ((ulong)params & 0x3f) & 1) != 0))
            )) {
        uVar10 = (long)pbVar16 * 3;
        lVar9 = *(long *)(vector + 0x28);
        if (lVar9 != 0) {
          bVar19 = 0xfffffffffffffffc < uVar10;
          if ((!bVar19) && ((*(ulong *)(lVar9 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0)) {
            lVar11 = 0;
            do {
              lVar18 = lVar11;
              if (lVar18 == 2) break;
              uVar1 = uVar10 + 1 + lVar18;
              lVar11 = lVar18 + 1;
            } while ((*(ulong *)(lVar9 + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) != 0);
            bVar19 = (long)pbVar16 * 3 + 3U <= uVar10 + lVar18 + 1;
          }
          if (!bVar19) {
            pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_e0[0] = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"%s: left argument can not contain NULL values","");
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_100,*(long *)(pBVar12 + 0x60),
                       *(long *)(pBVar12 + 0x68) + *(long *)(pBVar12 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_e0,&local_100,params);
            duckdb::InvalidInputException::InvalidInputException(pIVar15,(string *)&local_160);
            __cxa_throw(pIVar15,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        uVar10 = (long)params * 3;
        lVar9 = *(long *)(vector_00 + 0x28);
        if (lVar9 != 0) {
          bVar19 = 0xfffffffffffffffc < uVar10;
          params_00 = params;
          if ((!bVar19) && ((*(ulong *)(lVar9 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0)) {
            params_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)params * 3 + 3);
            lVar11 = 0;
            do {
              lVar18 = lVar11;
              if (lVar18 == 2) break;
              uVar1 = uVar10 + 1 + lVar18;
              lVar11 = lVar18 + 1;
            } while ((*(ulong *)(lVar9 + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) != 0);
            bVar19 = params_00 <=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar10 + lVar18 + 1);
          }
          if (!bVar19) {
            pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_120[0] = local_110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_120,"%s: right argument can not contain NULL values","");
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,*(long *)(pBVar12 + 0x60),
                       *(long *)(pBVar12 + 0x68) + *(long *)(pBVar12 + 0x60));
            StringUtil::Format<std::__cxx11::string>
                      (&local_160,(StringUtil *)local_120,&local_140,params_00);
            duckdb::InvalidInputException::InvalidInputException(pIVar15,(string *)&local_160);
            __cxa_throw(pIVar15,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
            ;
          }
        }
        fVar2 = *(float *)(lVar7 + (long)pbVar16 * 0xc);
        fVar3 = *(float *)(lVar8 + (long)params * 0xc);
        uVar4 = *(undefined8 *)(lVar7 + 4 + (long)pbVar16 * 0xc);
        uVar5 = *(undefined8 *)(lVar8 + 4 + (long)params * 0xc);
        fVar20 = (float)uVar4;
        fVar21 = (float)((ulong)uVar4 >> 0x20);
        fVar22 = (float)uVar5;
        fVar23 = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(lVar14 + (long)pbVar17 * 0xc) =
             CONCAT44(fVar3 * fVar21 - fVar2 * fVar23,fVar23 * fVar20 - fVar21 * fVar22);
        *(float *)(lVar14 + 8 + (long)pbVar17 * 0xc) = fVar2 * fVar22 - fVar3 * fVar20;
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pbVar17,true);
      }
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar17->_M_dataplus)._M_p + 1);
    } while (pbVar17 != pbVar6);
    if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}